

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O0

int LogL10fromY(double Y,int em)

{
  double dVar1;
  int em_local;
  double Y_local;
  
  if (Y < 15.742) {
    if (0.00024283 < Y) {
      dVar1 = log(Y);
      Y_local._4_4_ = tiff_itrunc((dVar1 * 1.4426950408889634 + 12.0) * 64.0,em);
    }
    else {
      Y_local._4_4_ = 0;
    }
  }
  else {
    Y_local._4_4_ = 0x3ff;
  }
  return Y_local._4_4_;
}

Assistant:

int
    LogL10fromY(double Y, int em) /* get 10-bit LogL from Y */
{
    if (Y >= 15.742)
        return (0x3ff);
    else if (Y <= .00024283)
        return (0);
    else
        return tiff_itrunc(64. * (log2(Y) + 12.), em);
}